

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::tent_dist<long_double>::pdf(tent_dist<long_double> *this,result_type_conflict3 x)

{
  result_type_conflict3 *prVar1;
  char *in_RCX;
  int in_EDX;
  param_type *in_RSI;
  param_type *in_RDI;
  int in_R8D;
  int in_R9D;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_stack_00000008;
  
  param_type::m(in_RDI,in_RSI,in_EDX,in_RCX,in_R8D,in_R9D);
  in_ST0 = in_stack_00000008 - in_ST0;
  prVar1 = param_type::d(&in_RDI->m_,in_RSI);
  if ((-in_ST1 < in_ST0) && (prVar1 = param_type::d(&in_RDI->m_,in_RSI), in_ST0 < in_ST2)) {
    if ((longdouble)0 <= in_ST0) {
      param_type::d(&in_RDI->m_,in_RSI);
      prVar1 = param_type::d(&in_RDI->m_,in_RSI);
    }
    else {
      param_type::d(&in_RDI->m_,in_RSI);
      prVar1 = param_type::d(&in_RDI->m_,in_RSI);
    }
  }
  return prVar1;
}

Assistant:

pdf(result_type x) const {
      x -= P.m();
      if (x <= -P.d() or x >= P.d())
        return 0;
      return x < 0 ? (1 + x / P.d()) / P.d() : (1 - x / P.d()) / P.d();
    }